

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime.c
# Opt level: O3

void * helper_lookup_tb_ptr_sparc64(CPUArchState_conflict19 *env)

{
  uint uVar1;
  uint64_t uVar2;
  ulong pc;
  target_ulong tVar3;
  TranslationBlock *pTVar4;
  tb_tc *ptVar5;
  uint uVar6;
  uint32_t cf_mask;
  ulong uVar7;
  
  uVar2 = env[-5].dmmu.mmuregs[0xb];
  uVar6 = 5;
  if (((*(byte *)(uVar2 + 0x1208) & 8) != 0) &&
     ((((*(uint *)(uVar2 + 0x20b0) >> 0xb & 1) == 0 || ((*(byte *)(uVar2 + 0x1fa0) & 4) == 0)) &&
      (uVar6 = 4, *(int *)(uVar2 + 0x1c4c) == 0)))) {
    uVar6 = *(uint *)(uVar2 + 0x1c48) >> 1 & 2;
  }
  pc = *(ulong *)(uVar2 + 0x48);
  uVar1 = *(uint *)(uVar2 + 0x1c48);
  uVar6 = ((uVar1 & 4) << 4 | uVar6) + (uVar1 & 8) * 4;
  if ((uVar1 & 0x10) != 0 && (*(uint *)(uVar2 + 0x20b0) & 1) != 0) {
    uVar6 = uVar6 + (*(uint *)(uVar2 + 0x1f68) & 4) * 4;
  }
  tVar3 = env[-1].regbase[0x1c6];
  uVar6 = *(int *)(uVar2 + 0x1c44) << 0x18 | uVar6;
  uVar7 = pc >> 7 ^ pc;
  uVar7 = (ulong)((uint)uVar7 & 0x3f | (uint)(uVar7 >> 7) & 0xfc0);
  pTVar4 = *(TranslationBlock **)((long)env + uVar7 * 8 + -0x9168);
  cf_mask = *(int *)((long)env[-1].regbase + 0xe1c) << 0x18;
  if ((((pTVar4 == (TranslationBlock *)0x0) || (pTVar4->pc != pc)) ||
      ((pTVar4->cs_base != *(target_ulong *)(uVar2 + 0x50) ||
       ((pTVar4->flags != uVar6 || (env[-1].regbase[0x1c2] != (ulong)pTVar4->trace_vcpu_dstate))))))
     || ((pTVar4->cflags & 0xff0effff) != cf_mask)) {
    pTVar4 = tb_htable_lookup_sparc64
                       ((CPUState *)(env[-5].regbase + 0x201),pc,*(target_ulong *)(uVar2 + 0x50),
                        uVar6,cf_mask);
    if (pTVar4 == (TranslationBlock *)0x0) {
      ptVar5 = (tb_tc *)(*(long *)(tVar3 + 0x2e8) + 0x98);
      goto LAB_00a33589;
    }
    *(TranslationBlock **)((long)env + uVar7 * 8 + -0x9168) = pTVar4;
  }
  ptVar5 = &pTVar4->tc;
LAB_00a33589:
  return ptVar5->ptr;
}

Assistant:

void *HELPER(lookup_tb_ptr)(CPUArchState *env)
{
    CPUState *cpu = env_cpu(env);
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    uint32_t flags;
    struct uc_struct *uc = (struct uc_struct *)cpu->uc;

    tb = tb_lookup__cpu_state(cpu, &pc, &cs_base, &flags, curr_cflags());
    if (tb == NULL) {
        return uc->tcg_ctx->code_gen_epilogue;
    }
    return tb->tc.ptr;
}